

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O1

int __thiscall QPrintDialogPrivate::init(QPrintDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  QAbstractPrintDialog *this_00;
  QIcon *pQVar1;
  QRadioButton *pQVar2;
  QLineEdit *pQVar3;
  QUnixPrintWidget *this_01;
  QPrinter *printer;
  QWidget *QPrintSettingsOutput;
  QDialogButtonBox *pQVar4;
  QPushButton *this_02;
  QString *pQVar5;
  QVBoxLayout *this_03;
  undefined4 *puVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QObject local_b8 [8];
  QObject local_b0 [8];
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  QObject local_90 [8];
  QObject local_88 [8];
  QObject local_80 [8];
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractPrintDialog **)&(this->super_QAbstractPrintDialogPrivate).field_0x8;
  this_01 = (QUnixPrintWidget *)operator_new(0x30);
  printer = QAbstractPrintDialog::printer(this_00);
  QUnixPrintWidget::QUnixPrintWidget((QUnixPrintWidget *)this_01,printer,(QWidget *)this_00);
  this->top = this_01;
  QPrintSettingsOutput = (QWidget *)operator_new(0x28);
  QWidget::QWidget(QPrintSettingsOutput,this_00,0);
  this->bottom = QPrintSettingsOutput;
  Ui_QPrintSettingsOutput::setupUi
            (&(this->options).super_Ui_QPrintSettingsOutput,QPrintSettingsOutput);
  local_58.d.d = (Data *)&DAT_2000000020;
  QAbstractButton::setIconSize((QSize *)(this->options).super_Ui_QPrintSettingsOutput.color);
  pQVar1 = (QIcon *)(this->options).super_Ui_QPrintSettingsOutput.color;
  QVar7.m_data = (storage_type *)0x3d;
  QVar7.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar7);
  local_78.d.d = local_58.d.d;
  local_78.d.ptr = local_58.d.ptr;
  local_78.d.size = local_58.d.size;
  QIcon::QIcon((QIcon *)&local_58,&local_78);
  QAbstractButton::setIcon(pQVar1);
  QIcon::~QIcon((QIcon *)&local_58);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_58.d.d = (Data *)&DAT_2000000020;
  QAbstractButton::setIconSize((QSize *)(this->options).super_Ui_QPrintSettingsOutput.grayscale);
  pQVar1 = (QIcon *)(this->options).super_Ui_QPrintSettingsOutput.grayscale;
  QVar8.m_data = (storage_type *)0x42;
  QVar8.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar8);
  local_78.d.d = local_58.d.d;
  local_78.d.ptr = local_58.d.ptr;
  local_78.d.size = local_58.d.size;
  QIcon::QIcon((QIcon *)&local_58,&local_78);
  QAbstractButton::setIcon(pQVar1);
  QIcon::~QIcon((QIcon *)&local_58);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (this->options).super_Ui_QPrintSettingsOutput.pagesRadioButton;
  if (pQVar2 != (QRadioButton *)0x0) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  pQVar3 = (this->options).super_Ui_QPrintSettingsOutput.pagesLineEdit;
  if (pQVar3 != (QLineEdit *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  (this->options).super_Ui_QPrintSettingsOutput.pagesRadioButton = (QRadioButton *)0x0;
  (this->options).super_Ui_QPrintSettingsOutput.pagesLineEdit = (QLineEdit *)0x0;
  this->top->d->optionsPane = this;
  selectPrinter(this,NativeFormat);
  pQVar4 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar4,0x400400,1,this_00);
  this->buttons = pQVar4;
  this_02 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_58,(char *)&QPrintDialog::staticMetaObject,0x157f1d);
  QPushButton::QPushButton(this_02,&local_58,(QWidget *)this->buttons);
  this->collapseButton = this_02;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  QDialogButtonBox::addButton((QAbstractButton *)this->buttons,(ButtonRole)this->collapseButton);
  (**(code **)(*(long *)this->bottom + 0x68))(this->bottom,0);
  pQVar5 = (QString *)QDialogButtonBox::button((StandardButton)this->buttons);
  QMetaObject::tr((char *)&local_58,(char *)&QPrintDialog::staticMetaObject,0x157f29);
  QAbstractButton::setText(pQVar5);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  QPushButton::setDefault(SUB81(pQVar5,0));
  this_03 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_03,(QWidget *)this_00);
  QBoxLayout::addWidget(this_03,this->top,0,0);
  QBoxLayout::addWidget(this_03,this->bottom,0,0);
  QBoxLayout::addWidget(this_03,this->buttons,0,0);
  QObject::connect(local_80,(char *)this->buttons,(QObject *)"2accepted()",(char *)this_00,0x157f30)
  ;
  QMetaObject::Connection::~Connection((Connection *)local_80);
  QObject::connect(local_88,(char *)this->buttons,(QObject *)"2rejected()",(char *)this_00,0x1574a6)
  ;
  QMetaObject::Connection::~Connection((Connection *)local_88);
  QObject::connect(local_90,(char *)(this->options).super_Ui_QPrintSettingsOutput.printSelection,
                   (QObject *)"2toggled(bool)",(char *)this_00,0x157f51);
  QMetaObject::Connection::~Connection((Connection *)local_90);
  QObject::connect(local_98,(char *)(this->options).super_Ui_QPrintSettingsOutput.printCurrentPage,
                   (QObject *)"2toggled(bool)",(char *)this_00,0x157f51);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  QObject::connect(local_a0,(char *)this->collapseButton,(QObject *)"2released()",(char *)this_00,
                   0x157f7a);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  pQVar2 = (this->options).super_Ui_QPrintSettingsOutput.noDuplex;
  local_58.d.d = (Data *)QAbstractButton::clicked;
  local_58.d.ptr = (char16_t *)0x0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/printsupport/dialogs/qprintdialog_unix.cpp:649:70),_QtPrivate::List<>,_void>
       ::impl;
  *(QPrintDialogPrivate **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_a8,(void **)pQVar2,(QObject *)&local_58,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  pQVar2 = (this->options).super_Ui_QPrintSettingsOutput.duplexLong;
  local_58.d.d = (Data *)QAbstractButton::clicked;
  local_58.d.ptr = (char16_t *)0x0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/printsupport/dialogs/qprintdialog_unix.cpp:650:72),_QtPrivate::List<>,_void>
       ::impl;
  *(QPrintDialogPrivate **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_b0,(void **)pQVar2,(QObject *)&local_58,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  pQVar2 = (this->options).super_Ui_QPrintSettingsOutput.duplexShort;
  local_58.d.d = (Data *)QAbstractButton::clicked;
  local_58.d.ptr = (char16_t *)0x0;
  puVar6 = (undefined4 *)operator_new(0x18);
  *puVar6 = 1;
  *(code **)(puVar6 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/printsupport/dialogs/qprintdialog_unix.cpp:651:73),_QtPrivate::List<>,_void>
       ::impl;
  *(QPrintDialogPrivate **)(puVar6 + 4) = this;
  QObject::connectImpl
            (local_b8,(void **)pQVar2,(QObject *)&local_58,(void **)this_00,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar6,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialogPrivate::init()
{
    Q_Q(QPrintDialog);

    top = new QUnixPrintWidget(q->printer(), q);
    bottom = new QWidget(q);
    options.setupUi(bottom);
    options.color->setIconSize(QSize(32, 32));
    options.color->setIcon(QIcon(":/qt-project.org/dialogs/qprintdialog/images/status-color.png"_L1));
    options.grayscale->setIconSize(QSize(32, 32));
    options.grayscale->setIcon(QIcon(":/qt-project.org/dialogs/qprintdialog/images/status-gray-scale.png"_L1));

#if QT_CONFIG(cups)
    // Add Page Set widget if CUPS is available
    options.pageSetCombo->addItem(tr("All Pages"), QVariant::fromValue(QCUPSSupport::AllPages));
    options.pageSetCombo->addItem(tr("Odd Pages"), QVariant::fromValue(QCUPSSupport::OddPages));
    options.pageSetCombo->addItem(tr("Even Pages"), QVariant::fromValue(QCUPSSupport::EvenPages));
#else
    delete options.pagesRadioButton;
    delete options.pagesLineEdit;
    options.pagesRadioButton = nullptr;
    options.pagesLineEdit = nullptr;
#endif

    top->d->setOptionsPane(this);

    buttons = new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel, Qt::Horizontal, q);
    collapseButton = new QPushButton(QPrintDialog::tr("&Options >>"), buttons);
    buttons->addButton(collapseButton, QDialogButtonBox::ResetRole);
    bottom->setVisible(false);

    QPushButton *printButton = buttons->button(QDialogButtonBox::Ok);
    printButton->setText(QPrintDialog::tr("&Print"));
    printButton->setDefault(true);

    QVBoxLayout *lay = new QVBoxLayout(q);
    lay->addWidget(top);
    lay->addWidget(bottom);
    lay->addWidget(buttons);

#if !QT_CONFIG(messagebox)
    QObject::connect(buttons, SIGNAL(accepted()), q, SLOT(accept()));
#else
    QObject::connect(buttons, SIGNAL(accepted()), q, SLOT(_q_checkFields()));
#endif
    QObject::connect(buttons, SIGNAL(rejected()), q, SLOT(reject()));

    QObject::connect(options.printSelection, SIGNAL(toggled(bool)),
                     q, SLOT(_q_togglePageSetCombo(bool)));

    QObject::connect(options.printCurrentPage, SIGNAL(toggled(bool)),
                     q, SLOT(_q_togglePageSetCombo(bool)));

    QObject::connect(collapseButton, SIGNAL(released()), q, SLOT(_q_collapseOrExpandDialog()));

    QObject::connect(options.noDuplex, &QAbstractButton::clicked, q, [this] { setExplicitDuplexMode(QPrint::DuplexNone); });
    QObject::connect(options.duplexLong, &QAbstractButton::clicked, q, [this] { setExplicitDuplexMode(QPrint::DuplexLongSide); });
    QObject::connect(options.duplexShort, &QAbstractButton::clicked, q, [this] { setExplicitDuplexMode(QPrint::DuplexShortSide); });

#if QT_CONFIG(cups)
    QObject::connect(options.noDuplex, &QAbstractButton::toggled, q, [this] { updatePpdDuplexOption(options.noDuplex); });
    QObject::connect(options.duplexLong, &QAbstractButton::toggled, q, [this] { updatePpdDuplexOption(options.duplexLong); });
    QObject::connect(options.duplexShort, &QAbstractButton::toggled, q, [this] { updatePpdDuplexOption(options.duplexShort); });
#endif
}